

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O1

action Search::single_prediction_notLDF
                 (search_private *priv,example *ec,int policy,action *allowed_actions,
                 size_t allowed_actions_cnt,float *allowed_actions_cost,float *a_cost,
                 action override_action)

{
  polylabel *ppVar1;
  uint64_t *puVar2;
  action aVar3;
  int iVar4;
  size_t sVar5;
  wclass *pwVar6;
  BaseTask *pBVar7;
  action_score *paVar8;
  stringstream *psVar9;
  _func_void_int_string_v_array<char> *p_Var10;
  label_t lVar11;
  wclass *pwVar12;
  wclass *pwVar13;
  size_t sVar14;
  size_t sVar15;
  label_t lVar16;
  v_array<char> vVar17;
  polylabel *ppVar18;
  single_learner *psVar19;
  wclass *pwVar20;
  ostream *poVar21;
  vw_exception *this;
  float *pfVar22;
  long lVar23;
  byte bVar24;
  size_t k;
  long lVar25;
  ulong uVar26;
  float *pfVar27;
  v_array<std::pair<COST_SENSITIVE::wclass_&,_bool>_> *pvVar28;
  action_score *paVar29;
  ulong uVar30;
  bool bVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  v_array<Search::action_cache> *this_cache;
  polylabel old_label;
  pair<COST_SENSITIVE::wclass_&,_bool> p;
  undefined4 in_stack_fffffffffffffdb8;
  action aVar36;
  float in_stack_fffffffffffffdc0;
  float in_stack_fffffffffffffdc4;
  v_array<Search::action_cache> *in_stack_fffffffffffffdc8;
  vw *pvVar37;
  undefined1 *local_1f8;
  undefined1 local_1e8 [16];
  string local_1d8;
  undefined1 local_1b8 [8];
  undefined8 uStack_1b0;
  ostream local_1a8;
  
  pvVar37 = priv->all;
  sVar5 = (ec->l).cb_eval.event.costs.erase_count;
  lVar11 = (ec->l).multi;
  pwVar12 = (ec->l).cs.costs._end;
  pwVar13 = (ec->l).cs.costs.end_array;
  sVar14 = (ec->l).cs.costs.erase_count;
  bVar24 = 1;
  if (((priv->state != INIT_TRAIN) || (priv->metatask == (search_metatask *)0x0)) ||
     (priv->metaoverride == (BaseTask *)0x0)) {
    if (priv->metaoverride == (BaseTask *)0x0) {
      if (override_action != 0xffffffff) goto LAB_0011f41c;
    }
    else if ((override_action != 0xffffffff) ||
            (priv->metaoverride->_foreach_action !=
             (_func_void_search_ptr_size_t_float_action_bool_float *)0x0)) goto LAB_0011f41c;
    bVar24 = priv->active_csoaa;
  }
LAB_0011f41c:
  ppVar1 = &ec->l;
  if (allowed_actions_cnt == 0 && (bVar24 & 1) == 0) {
    lVar16 = (label_t)(priv->empty_cs_label).costs._begin;
    pwVar20 = (priv->empty_cs_label).costs._end;
    sVar15 = (priv->empty_cs_label).costs.erase_count;
    (ec->l).cs.costs.end_array = (priv->empty_cs_label).costs.end_array;
    (ec->l).cs.costs.erase_count = sVar15;
    ppVar1->multi = lVar16;
    (ec->l).cs.costs._end = pwVar20;
  }
  else {
    ppVar18 = allowed_actions_to_ld(priv,1,allowed_actions,allowed_actions_cnt,allowed_actions_cost)
    ;
    pwVar20 = (ppVar18->cs).costs._end;
    pwVar6 = (ppVar18->cs).costs.end_array;
    sVar15 = (ppVar18->cs).costs.erase_count;
    ppVar1->multi = ppVar18->multi;
    (ec->l).cs.costs._end = pwVar20;
    (ec->l).cs.costs.end_array = pwVar6;
    (ec->l).cs.costs.erase_count = sVar15;
    (ec->l).cb_eval.event.costs.erase_count = (ppVar18->cb_eval).event.costs.erase_count;
  }
  psVar19 = LEARNER::as_singleline<char,char>(priv->base_learner);
  puVar2 = &(ec->super_example_predict).ft_offset;
  *puVar2 = *puVar2 + (ulong)(uint)(*(int *)(psVar19 + 0xe0) * policy);
  (**(code **)(psVar19 + 0x30))(*(undefined8 *)(psVar19 + 0x18),*(undefined8 *)(psVar19 + 0x20),ec);
  puVar2 = &(ec->super_example_predict).ft_offset;
  *puVar2 = *puVar2 - (ulong)(uint)(policy * *(int *)(psVar19 + 0xe0));
  aVar36 = override_action;
  if (override_action == 0xffffffff) {
    aVar36 = (ec->pred).multiclass;
  }
  *a_cost = ec->partial_prediction;
  if (bVar24 != 0) {
    pwVar20 = (ec->l).cs.costs._begin;
    pwVar6 = (ec->l).cs.costs._end;
    lVar25 = (long)pwVar6 - (long)pwVar20 >> 4;
    if (pwVar6 == pwVar20) {
      fVar33 = 3.4028235e+38;
    }
    else {
      lVar23 = lVar25 + (ulong)(lVar25 == 0);
      pfVar22 = &((ppVar1->cs).costs._begin)->wap_value;
      fVar32 = 3.4028235e+38;
      do {
        pfVar27 = pfVar22 + -1;
        if (priv->cb_learner != false) {
          pfVar27 = pfVar22;
        }
        fVar33 = *pfVar27;
        if (fVar32 <= *pfVar27) {
          fVar33 = fVar32;
        }
        pfVar22 = pfVar22 + 4;
        lVar23 = lVar23 + -1;
        fVar32 = fVar33;
      } while (lVar23 != 0);
    }
    in_stack_fffffffffffffdc8 = (v_array<Search::action_cache> *)0x0;
    bVar31 = false;
    if ((priv->state == INIT_TRAIN) && (bVar31 = false, priv->metatask != (search_metatask *)0x0)) {
      bVar31 = priv->metaoverride != (BaseTask *)0x0;
    }
    if ((override_action == 0xffffffff) && (bVar31)) {
      in_stack_fffffffffffffdc8 = (v_array<Search::action_cache> *)operator_new(0x20);
      in_stack_fffffffffffffdc8->_begin = (action_cache *)0x0;
      in_stack_fffffffffffffdc8->_end = (action_cache *)0x0;
      in_stack_fffffffffffffdc8->end_array = (action_cache *)0x0;
      in_stack_fffffffffffffdc8->erase_count = 0;
    }
    in_stack_fffffffffffffdc0 = fVar33;
    if (pwVar6 != pwVar20) {
      lVar25 = lVar25 + (ulong)(lVar25 == 0);
      lVar23 = 0;
      do {
        pwVar20 = (ppVar1->cs).costs._begin;
        aVar3 = *(action *)((long)&pwVar20->class_index + lVar23);
        fVar32 = *(float *)((long)&pwVar20->partial_prediction +
                           (ulong)priv->cb_learner * 4 + lVar23);
        pBVar7 = priv->metaoverride;
        if ((pBVar7 != (BaseTask *)0x0) &&
           (pBVar7->_foreach_action != (_func_void_search_ptr_size_t_float_action_bool_float *)0x0))
        {
          (*pBVar7->_foreach_action)(pBVar7->sch,priv->t - 1,fVar33,aVar3,aVar3 == aVar36,fVar32);
          fVar33 = in_stack_fffffffffffffdc0;
          in_stack_fffffffffffffdc0 = fVar33;
          in_stack_fffffffffffffdc4 = fVar32;
        }
        if (aVar3 == override_action) {
          *a_cost = fVar32;
        }
        if (in_stack_fffffffffffffdc8 != (v_array<Search::action_cache> *)0x0) {
          local_1b8._4_4_ = aVar3;
          local_1b8._0_4_ = fVar33;
          uStack_1b0 = (pair<COST_SENSITIVE::wclass_&,_bool> *)
                       CONCAT71(uStack_1b0._1_7_,aVar3 == aVar36);
          uStack_1b0 = (pair<COST_SENSITIVE::wclass_&,_bool> *)
                       CONCAT44(fVar32,(undefined4)uStack_1b0);
          fVar33 = in_stack_fffffffffffffdc0;
          v_array<Search::action_cache>::push_back
                    (in_stack_fffffffffffffdc8,(action_cache *)local_1b8);
          in_stack_fffffffffffffdc0 = fVar33;
        }
        lVar23 = lVar23 + 0x10;
        lVar25 = lVar25 + -1;
      } while (lVar25 != 0);
    }
    if (in_stack_fffffffffffffdc8 != (v_array<Search::action_cache> *)0x0) {
      v_array<v_array<Search::action_cache>_*>::push_back
                (&priv->memo_foreach_action,
                 (v_array<Search::action_cache> **)&stack0xfffffffffffffdc8);
    }
  }
  if ((priv->state == INIT_TRAIN) && (priv->subsample_timesteps <= -1.0)) {
    fVar33 = 3.4028235e+38;
    fVar32 = 3.4028235e+38;
    lVar25 = (long)(ec->l).cs.costs._end - (long)(ec->l).cs.costs._begin;
    if (lVar25 != 0) {
      lVar25 = lVar25 >> 4;
      lVar25 = lVar25 + (ulong)(lVar25 == 0);
      pfVar22 = &((ppVar1->cs).costs._begin)->wap_value;
      fVar34 = 3.4028235e+38;
      fVar35 = 3.4028235e+38;
      do {
        pfVar27 = pfVar22 + -1;
        if (priv->cb_learner != false) {
          pfVar27 = pfVar22;
        }
        fVar33 = *pfVar27;
        fVar32 = fVar35;
        if ((fVar35 <= fVar33) &&
           (bVar31 = fVar34 <= fVar33, fVar32 = fVar33, fVar33 = fVar35, bVar31)) {
          fVar32 = fVar34;
        }
        pfVar22 = pfVar22 + 4;
        lVar25 = lVar25 + -1;
        fVar34 = fVar32;
        fVar35 = fVar33;
      } while (lVar25 != 0);
    }
    if (fVar32 < 3.4028235e+38) {
      uStack_1b0 = (pair<COST_SENSITIVE::wclass_&,_bool> *)(priv->meta_t + priv->t);
      local_1b8._0_4_ = fVar32 - fVar33;
      v_array<std::pair<float,_unsigned_long>_>::push_back
                (&priv->active_uncertainty,(pair<float,_unsigned_long> *)local_1b8);
    }
  }
  if ((priv->state == INIT_TRAIN) && (priv->active_csoaa == true)) {
    if (priv->cb_learner == true) {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>
                (&local_1a8,"cannot use active_csoaa with cb learning",0x28);
      this = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (this,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/search.cc"
                 ,0x496,&local_1d8);
      __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    uVar26 = (priv->t + priv->meta_t) - 1;
    pvVar28 = (priv->active_known)._begin;
    if ((ulong)((long)(priv->active_known)._end - (long)pvVar28 >> 5) <= uVar26) {
      do {
        local_1a8._vptr_basic_ostream = (_func_int **)0x0;
        local_1a8._8_8_ = 0;
        local_1b8 = (undefined1  [8])0x0;
        uStack_1b0 = (pair<COST_SENSITIVE::wclass_&,_bool> *)0x0;
        v_array<v_array<std::pair<COST_SENSITIVE::wclass_&,_bool>_>_>::push_back
                  (&priv->active_known,
                   (v_array<std::pair<COST_SENSITIVE::wclass_&,_bool>_> *)local_1b8);
        pvVar28 = (priv->active_known)._end;
        pvVar28[-1].end_array = (pair<COST_SENSITIVE::wclass_&,_bool> *)0x0;
        pvVar28[-1].erase_count = 0;
        pvVar28[-1]._begin = (pair<COST_SENSITIVE::wclass_&,_bool> *)0x0;
        pvVar28[-1]._end = (pair<COST_SENSITIVE::wclass_&,_bool> *)0x0;
        pvVar28 = (priv->active_known)._begin;
      } while ((ulong)((long)(priv->active_known)._end - (long)pvVar28 >> 5) <= uVar26);
    }
    v_array<std::pair<COST_SENSITIVE::wclass_&,_bool>_>::clear(pvVar28 + uVar26);
    pwVar20 = (ec->l).cs.costs._begin;
    if ((ec->l).cs.costs._end != pwVar20) {
      uVar30 = 0;
      do {
        paVar29 = (ec->pred).a_s._begin;
        paVar8 = (action_score *)(ec->pred).scalars._end;
        bVar31 = paVar29 != paVar8;
        if (bVar31) {
          fVar33 = (float)paVar29->action;
          while (fVar33 != (float)pwVar20[uVar30].class_index) {
            paVar29 = (action_score *)&paVar29->score;
            bVar31 = paVar29 != paVar8;
            if (paVar29 == paVar8) break;
            fVar33 = *(float *)paVar29;
          }
        }
        local_1b8 = (undefined1  [8])(pwVar20 + uVar30);
        uStack_1b0 = (pair<COST_SENSITIVE::wclass_&,_bool> *)CONCAT71(uStack_1b0._1_7_,bVar31);
        v_array<std::pair<COST_SENSITIVE::wclass_&,_bool>_>::push_back
                  ((priv->active_known)._begin + uVar26,
                   (pair<COST_SENSITIVE::wclass_&,_bool> *)local_1b8);
        uVar30 = uVar30 + 1;
        pwVar20 = (ec->l).cs.costs._begin;
      } while (uVar30 < (ulong)((long)(ec->l).cs.costs._end - (long)pwVar20 >> 4));
    }
  }
  if ((priv->state == INIT_TEST) && (0 < pvVar37->raw_prediction)) {
    psVar9 = priv->rawOutputStringStream;
    local_1b8 = (undefined1  [8])&local_1a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"");
    std::__cxx11::stringbuf::str((string *)(psVar9 + 0x18));
    if (local_1b8 != (undefined1  [8])&local_1a8) {
      operator_delete((void *)local_1b8);
    }
    lVar25 = 8;
    for (uVar26 = 0;
        uVar26 < (ulong)((long)(ec->l).cs.costs._end - (long)(ec->l).cs.costs._begin >> 4);
        uVar26 = uVar26 + 1) {
      if (uVar26 != 0) {
        local_1b8[0] = 0x20;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(priv->rawOutputStringStream + 0x10),local_1b8,1);
      }
      poVar21 = std::ostream::_M_insert<unsigned_long>((ulong)(priv->rawOutputStringStream + 0x10));
      local_1b8[0] = 0x3a;
      std::__ostream_insert<char,std::char_traits<char>>(poVar21,local_1b8,1);
      pwVar20 = (ppVar1->cs).costs._begin;
      pfVar22 = &pwVar20->x;
      if (priv->cb_learner != false) {
        pfVar22 = (float *)&pwVar20->class_index;
      }
      std::ostream::_M_insert<double>((double)*(float *)((long)pfVar22 + lVar25));
      lVar25 = lVar25 + 0x10;
    }
    p_Var10 = pvVar37->print_text;
    iVar4 = pvVar37->raw_prediction;
    std::__cxx11::stringbuf::str();
    vVar17._begin._4_4_ = aVar36;
    vVar17._begin._0_4_ = in_stack_fffffffffffffdb8;
    vVar17._end._0_4_ = in_stack_fffffffffffffdc0;
    vVar17._end._4_4_ = in_stack_fffffffffffffdc4;
    vVar17.end_array = (char *)in_stack_fffffffffffffdc8;
    vVar17.erase_count = (size_t)pvVar37;
    (*p_Var10)(iVar4,(string)ec->tag,vVar17);
    if (local_1f8 != local_1e8) {
      operator_delete(local_1f8);
    }
  }
  (ec->l).cb_eval.event.costs.erase_count = sVar5;
  (ec->l).cs.costs.end_array = pwVar13;
  (ec->l).cs.costs.erase_count = sVar14;
  ppVar1->multi = lVar11;
  (ec->l).cs.costs._end = pwVar12;
  priv->total_predictions_made = priv->total_predictions_made + 1;
  priv->num_features = priv->num_features + ec->num_features;
  return aVar36;
}

Assistant:

action single_prediction_notLDF(search_private& priv, example& ec, int policy, const action* allowed_actions,
    size_t allowed_actions_cnt, const float* allowed_actions_cost, float& a_cost,
    action override_action)  // if override_action != -1, then we return it as the action and a_cost is set to the
                             // appropriate cost for that action
{
  vw& all = *priv.all;
  polylabel old_label = ec.l;
  bool need_partial_predictions = need_memo_foreach_action(priv) ||
      (priv.metaoverride && priv.metaoverride->_foreach_action) || (override_action != (action)-1) || priv.active_csoaa;
  if ((allowed_actions_cnt > 0) || need_partial_predictions)
    ec.l = allowed_actions_to_ld(priv, 1, allowed_actions, allowed_actions_cnt, allowed_actions_cost);
  else
    ec.l.cs = priv.empty_cs_label;

  cdbg << "allowed_actions_cnt=" << allowed_actions_cnt << ", ec.l = [";
  for (size_t i = 0; i < ec.l.cs.costs.size(); i++)
    cdbg << ' ' << ec.l.cs.costs[i].class_index << ':' << ec.l.cs.costs[i].x;
  cdbg << " ]" << endl;

  as_singleline(priv.base_learner)->predict(ec, policy);

  uint32_t act = ec.pred.multiclass;
  cdbg << "a=" << act << " from";
  if (allowed_actions)
  {
    for (size_t ii = 0; ii < allowed_actions_cnt; ii++) cdbg << ' ' << allowed_actions[ii];
  }
  cdbg << endl;
  a_cost = ec.partial_prediction;
  cdbg << "a_cost = " << a_cost << endl;

  if (override_action != (action)-1)
    act = override_action;

  if (need_partial_predictions)
  {
    size_t K = cs_get_costs_size(priv.cb_learner, ec.l);
    float min_cost = FLT_MAX;
    for (size_t k = 0; k < K; k++)
    {
      float cost = cs_get_cost_partial_prediction(priv.cb_learner, ec.l, k);
      if (cost < min_cost)
        min_cost = cost;
    }
    v_array<action_cache>* this_cache = nullptr;
    if (need_memo_foreach_action(priv) && (override_action == (action)-1))
    {
      this_cache = new v_array<action_cache>();
      *this_cache = v_init<action_cache>();
    }
    for (size_t k = 0; k < K; k++)
    {
      action cl = cs_get_cost_index(priv.cb_learner, ec.l, k);
      float cost = cs_get_cost_partial_prediction(priv.cb_learner, ec.l, k);
      if (priv.metaoverride && priv.metaoverride->_foreach_action)
        priv.metaoverride->_foreach_action(*priv.metaoverride->sch, priv.t - 1, min_cost, cl, cl == act, cost);
      if (override_action == cl)
        a_cost = cost;
      if (this_cache)
        this_cache->push_back(action_cache(min_cost, cl, cl == act, cost));
    }
    if (this_cache)
    {
      assert(priv.memo_foreach_action.size() == priv.meta_t + priv.t - 1);
      priv.memo_foreach_action.push_back(this_cache);
      cdbg << "memo_foreach_action[" << priv.meta_t + priv.t - 1 << "] = " << this_cache << endl;
    }
  }

  if ((priv.state == INIT_TRAIN) && (priv.subsample_timesteps <= -1))  // active learning
  {
    size_t K = cs_get_costs_size(priv.cb_learner, ec.l);
    float min_cost = FLT_MAX, min_cost2 = FLT_MAX;
    for (size_t k = 0; k < K; k++)
    {
      float cost = cs_get_cost_partial_prediction(priv.cb_learner, ec.l, k);
      if (cost < min_cost)
      {
        min_cost2 = min_cost;
        min_cost = cost;
      }
      else if (cost < min_cost2)
      {
        min_cost2 = cost;
      }
    }
    if (min_cost2 < FLT_MAX)
      priv.active_uncertainty.push_back(make_pair(min_cost2 - min_cost, priv.t + priv.meta_t));
  }
  if ((priv.state == INIT_TRAIN) && priv.active_csoaa)
  {
    if (priv.cb_learner)
      THROW("cannot use active_csoaa with cb learning");
    size_t cur_t = priv.t + priv.meta_t - 1;
    while (priv.active_known.size() <= cur_t)
    {
      priv.active_known.push_back(v_array<pair<CS::wclass&, bool>>());
      priv.active_known[priv.active_known.size() - 1] = v_init<pair<CS::wclass&, bool>>();
      cdbg << "active_known length now " << priv.active_known.size() << endl;
    }
    priv.active_known[cur_t].clear();
    assert(ec.l.cs.costs.size() > 0);
    for (size_t k = 0; k < ec.l.cs.costs.size(); k++)
    {
      /* priv.active_known[cur_t].push_back( ec.l.cs.costs[k].pred_is_certain
                                          ? ec.l.cs.costs[k].partial_prediction
                                          : FLT_MAX );
                                          cdbg << "active_known[" << cur_t << "][" << (priv.active_known[cur_t].size() -
         1) << "] = certain=" << ec.l.cs.costs[k].pred_is_certain << ", cost=" << ec.l.cs.costs[k].partial_prediction <<
         "}" << endl; */
      CS::wclass& wc = ec.l.cs.costs[k];
      // Get query_needed from pred
      bool query_needed = v_array_contains(ec.pred.multilabels.label_v, wc.class_index);
      pair<CS::wclass&, bool> p = {wc, query_needed};
      // Push into active_known[cur_t] with wc
      priv.active_known[cur_t].push_back(p);
      // cdbg << "active_known[" << cur_t << "][" << (priv.active_known[cur_t].size() - 1) << "] = " << wc.class_index
      // << ':' << wc.x << " pp=" << wc.partial_prediction << " query_needed=" << wc.query_needed << " max_pred=" <<
      // wc.max_pred << " min_pred=" << wc.min_pred << " is_range_overlapped=" << wc.is_range_overlapped << "
      // is_range_large=" << wc.is_range_large << endl;
      // query_needed=" << ec.l.cs.costs[k].query_needed << ", cost=" << ec.l.cs.costs[k].partial_prediction << "}" <<
      // endl;
    }
  }

  // generate raw predictions if necessary
  if ((priv.state == INIT_TEST) && (all.raw_prediction > 0))
  {
    priv.rawOutputStringStream->str("");
    for (size_t k = 0; k < cs_get_costs_size(priv.cb_learner, ec.l); k++)
    {
      if (k > 0)
        (*priv.rawOutputStringStream) << ' ';
      (*priv.rawOutputStringStream) << cs_get_cost_index(priv.cb_learner, ec.l, k) << ':'
                                    << cs_get_cost_partial_prediction(priv.cb_learner, ec.l, k);
    }
    all.print_text(all.raw_prediction, priv.rawOutputStringStream->str(), ec.tag);
  }

  ec.l = old_label;

  priv.total_predictions_made++;
  priv.num_features += ec.num_features;

  return act;
}